

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O0

size_type fs_resolve(char *path,bool strict,bool expand_tilde,char *result,size_type buffer_size)

{
  size_type sVar1;
  string_view local_68;
  string local_58;
  __sv_type local_38;
  size_type local_28;
  size_type buffer_size_local;
  char *result_local;
  bool expand_tilde_local;
  char *pcStack_10;
  bool strict_local;
  char *path_local;
  
  local_28 = buffer_size;
  buffer_size_local = (size_type)result;
  result_local._6_1_ = expand_tilde;
  result_local._7_1_ = strict;
  pcStack_10 = path;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,path);
  fs_resolve_abi_cxx11_
            (&local_58,local_68,(bool)(result_local._7_1_ & 1),(bool)(result_local._6_1_ & 1));
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  sVar1 = fs_str2char(local_38,(char *)buffer_size_local,local_28);
  std::__cxx11::string::~string((string *)&local_58);
  return sVar1;
}

Assistant:

std::string::size_type fs_resolve(const char* path, const bool strict, const bool expand_tilde,
                         char* result, const std::string::size_type buffer_size){
  return fs_str2char(fs_resolve(path, strict, expand_tilde), result, buffer_size);
}